

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::absF16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  Literal *this_00;
  long lVar1;
  undefined1 local_120 [8];
  LaneArray<8> lanes;
  Literal local_48;
  
  getLanesF16x8((LaneArray<8> *)local_120,this);
  lVar1 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[7].type;
  do {
    this_00 = (Literal *)(local_120 + lVar1);
    abs(&local_48,(int)this_00);
    convertF32ToF16((Literal *)__return_storage_ptr___00,&local_48);
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    ~Literal(&local_48);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal(__return_storage_ptr__,(LaneArray<8> *)local_120);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)(local_120 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absF16x8() const {
  return unary<8, &Literal::getLanesF16x8, &Literal::abs, &toFP16>(*this);
}